

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance.c
# Opt level: O0

void highbd_obmc_variance64
               (uint8_t *pre8,int pre_stride,int32_t *wsrc,int32_t *mask,int w,int h,uint64_t *sse,
               int64_t *sum)

{
  int local_50;
  int diff;
  int64_t tsum;
  uint64_t tsse;
  uint16_t *pre;
  int j;
  int i;
  int h_local;
  int w_local;
  int32_t *mask_local;
  int32_t *wsrc_local;
  int pre_stride_local;
  uint8_t *pre8_local;
  
  pre = (uint16_t *)((long)pre8 << 1);
  tsse = 0;
  tsum = 0;
  mask_local = mask;
  wsrc_local = wsrc;
  for (i = 0; i < h; i = i + 1) {
    for (j = 0; j < w; j = j + 1) {
      if ((int)(wsrc_local[j] - (uint)pre[j] * mask_local[j]) < 0) {
        local_50 = -((int)(0x800 - (wsrc_local[j] - (uint)pre[j] * mask_local[j])) >> 0xc);
      }
      else {
        local_50 = (int)((wsrc_local[j] - (uint)pre[j] * mask_local[j]) + 0x800) >> 0xc;
      }
      tsum = local_50 + tsum;
      tsse = (long)(local_50 * local_50) + tsse;
    }
    pre = pre + pre_stride;
    wsrc_local = wsrc_local + w;
    mask_local = mask_local + w;
  }
  *sse = tsse;
  *sum = tsum;
  return;
}

Assistant:

static inline void highbd_obmc_variance64(const uint8_t *pre8, int pre_stride,
                                          const int32_t *wsrc,
                                          const int32_t *mask, int w, int h,
                                          uint64_t *sse, int64_t *sum) {
  int i, j;
  uint16_t *pre = CONVERT_TO_SHORTPTR(pre8);
  uint64_t tsse = 0;
  int64_t tsum = 0;

  for (i = 0; i < h; i++) {
    for (j = 0; j < w; j++) {
      int diff = ROUND_POWER_OF_TWO_SIGNED(wsrc[j] - pre[j] * mask[j], 12);
      tsum += diff;
      tsse += diff * diff;
    }

    pre += pre_stride;
    wsrc += w;
    mask += w;
  }
  *sse = tsse;
  *sum = tsum;
}